

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O2

void splitLine(wstring *line,wstring *name,wstring *arguments)

{
  int iVar1;
  ulong uVar2;
  pointer pwVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  std::__cxx11::wstring::assign((wchar_t *)name);
  std::__cxx11::wstring::assign((wchar_t *)arguments);
  pwVar3 = (line->_M_dataplus)._M_p;
  uVar2 = line->_M_string_length;
  uVar6 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = uVar2 & 0xffffffff;
  }
  for (; uVar7 = uVar5, uVar5 != uVar6; uVar6 = uVar6 + 1) {
    if ((pwVar3[uVar6] != L'\t') && (pwVar3[uVar6] != L' ')) {
      uVar5 = uVar6 & 0xffffffff;
      uVar7 = uVar6;
      break;
    }
  }
  do {
    iVar1 = (int)uVar2;
    if ((long)iVar1 <= (long)uVar7) break;
    if (pwVar3[uVar7] == L'\0') {
      return;
    }
    if (pwVar3[uVar7] == L' ') break;
    std::__cxx11::wstring::push_back((wchar_t)name);
    uVar5 = (ulong)((int)uVar5 + 1);
    pwVar3 = (line->_M_dataplus)._M_p;
    uVar2 = line->_M_string_length;
    uVar7 = uVar7 + 1;
  } while( true );
  if ((int)uVar5 <= iVar1) {
    uVar5 = uVar2 & 0xffffffff;
  }
  do {
    uVar4 = (uint)uVar5;
    if ((long)iVar1 <= (long)uVar7) {
LAB_0014122f:
      for (uVar5 = (ulong)uVar4;
          ((long)uVar5 < (long)(int)uVar2 && ((line->_M_dataplus)._M_p[uVar5] != L'\0'));
          uVar5 = uVar5 + 1) {
        std::__cxx11::wstring::push_back((wchar_t)arguments);
        uVar2 = line->_M_string_length;
      }
      return;
    }
    if ((pwVar3[uVar7] != L' ') && (pwVar3[uVar7] != L'\t')) {
      uVar4 = (uint)uVar7;
      goto LAB_0014122f;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void splitLine(std::wstring& line, std::wstring& name, std::wstring& arguments)
{
	int linePos = 0;
	name = L"";
	arguments = L"";

	while (linePos < (int)line.size() && (line[linePos] == ' ' || line[linePos] == '\t')) linePos++;
	while (linePos < (int)line.size() && line[linePos] != ' ')
	{
		if (line[linePos]  == 0)
		{
			return;
		}
		name += line[linePos++];
	}
	
	while (linePos < (int)line.size() && (line[linePos] == ' ' || line[linePos] == '\t')) linePos++;

	while (linePos < (int)line.size() && line[linePos] != 0)
	{
		arguments += line[linePos++];
	}
}